

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O3

uint zvgReadDeviceID(ZvgID_s *devID)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined8 in_RAX;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  uint idLen;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  uVar2 = zvgGetDeviceID(ZvgIO.mBfr,0x100,&local_34);
  if (((uVar2 == 0) && (uVar2 = zvgSetEcpMode(), uVar2 == 0)) &&
     (uVar2 = 0x1d, ZvgIO.mBfr._0_4_ == 0x3a47464d)) {
    uVar8 = (ulong)local_34;
    lVar5 = 0;
    uVar9 = 4;
    do {
      if ((ZvgIO.mBfr[lVar5 + 4] == ';') || (uVar8 <= uVar9)) goto LAB_00104c51;
      devID->mfg[lVar5] = ZvgIO.mBfr[lVar5 + 4];
      lVar5 = lVar5 + 1;
      bVar10 = uVar9 != 0x13;
      uVar9 = uVar9 + 1;
    } while (bVar10);
    lVar5 = 0x10;
    uVar9 = 0x14;
LAB_00104c51:
    devID->mfg[lVar5] = '\0';
    uVar7 = (int)uVar9 + 3;
    iVar3 = strncmp((char *)(ZvgIO.mBfr + uVar7),"CMD:",4);
    if (uVar7 < local_34 && iVar3 == 0) {
      uVar7 = (int)uVar9 + 0x17;
      uVar6 = (uVar9 & 0xffffffff) + 7;
      lVar5 = 0;
      do {
        cVar1 = *(char *)((uVar9 & 0xffffffff) + 0x10932b + lVar5);
        if ((cVar1 == ';') || (uVar8 <= uVar6)) {
          uVar7 = (uint)uVar6;
          goto LAB_00104cc8;
        }
        uVar6 = uVar6 + 1;
        devID->cmd[lVar5] = cVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x10);
      lVar5 = 0x10;
LAB_00104cc8:
      devID->cmd[lVar5] = '\0';
      iVar3 = strncmp((char *)(ZvgIO.mBfr + (uVar7 + 3)),"MDL:",4);
      if (uVar7 + 3 < local_34 && iVar3 == 0) {
        iVar3 = uVar7 + 0x17;
        uVar9 = (ulong)uVar7 + 7;
        lVar5 = 0;
        do {
          cVar1 = *(char *)((ulong)uVar7 + 0x10932b + lVar5);
          if ((cVar1 == ';') || (uVar8 <= uVar9)) {
            iVar3 = (int)uVar9;
            goto LAB_00104d40;
          }
          uVar9 = uVar9 + 1;
          devID->mdl[lVar5] = cVar1;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x10);
        lVar5 = 0x10;
LAB_00104d40:
        devID->mdl[lVar5] = '\0';
        iVar4 = strncmp((char *)(ZvgIO.mBfr + (iVar3 + 3U)),"VER:",4);
        if (iVar3 + 3U < local_34 && iVar4 == 0) {
          uVar9 = strtoul((char *)(ZvgIO.mBfr + (iVar3 + 7)),(char **)0x0,0x10);
          devID->fVer = (uint)uVar9;
          if (iVar3 + 0xbU < local_34 && ZvgIO.mBfr[iVar3 + 0xbU] == ',') {
            uVar9 = strtoul((char *)(ZvgIO.mBfr + (iVar3 + 0xc)),(char **)0x0,0x10);
            devID->bVer = (uint)uVar9;
            if (iVar3 + 0x10U < local_34 && ZvgIO.mBfr[iVar3 + 0x10U] == ',') {
              uVar9 = strtoul((char *)(ZvgIO.mBfr + (iVar3 + 0x11)),(char **)0x0,0x10);
              devID->vVer = (uint)uVar9;
              if (((iVar3 + 0x15U < local_34 && ZvgIO.mBfr[iVar3 + 0x15U] == ';') &&
                  (iVar4 = strncmp((char *)(ZvgIO.mBfr + (iVar3 + 0x18U)),"SWS:",4),
                  iVar3 + 0x18U < local_34)) && (iVar4 == 0)) {
                uVar9 = strtoul((char *)(ZvgIO.mBfr + (iVar3 + 0x1c)),(char **)0x0,0x10);
                devID->sws = (uint)uVar9;
                if (((iVar3 + 0x1eU < local_34 && ZvgIO.mBfr[iVar3 + 0x1eU] == ';') &&
                    (iVar4 = strncmp((char *)(ZvgIO.mBfr + (iVar3 + 0x21U)),"ESB:",4),
                    iVar3 + 0x21U < local_34)) && (iVar4 == 0)) {
                  uVar9 = strtoul((char *)(ZvgIO.mBfr + (iVar3 + 0x25)),(char **)0x0,0x10);
                  devID->fESB = (uint)uVar9;
                  if (iVar3 + 0x29U < local_34 && ZvgIO.mBfr[iVar3 + 0x29U] == ',') {
                    uVar9 = strtoul((char *)(ZvgIO.mBfr + (iVar3 + 0x2a)),(char **)0x0,0x10);
                    devID->vESB = (uint)uVar9;
                    uVar2 = 0;
                    if (local_34 <= iVar3 + 0x2eU) {
                      uVar2 = 0x1d;
                    }
                    if (ZvgIO.mBfr[iVar3 + 0x2eU] != ';') {
                      uVar2 = 0x1d;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

uint zvgReadDeviceID( ZvgID_s *devID)
{
	uint	idLen, err, ii, jj;

	err = zvgGetDeviceID( ZvgIO.mBfr, ZVG_MAX_BFRSZ, &idLen);

	if (err)
		return (err);

	// return to ECP mode

	err = zvgSetEcpMode();

	if (err)
		return (err);

	// parse buffer

	ii = 0;

	// Get "MFG:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "MFG:", 4) != 0)
		return (errUnknownID);

	ii += 4;

	for (jj = 0; jj < ZVG_MAX_IDSZ-1 && ZvgIO.mBfr[ii] != ';' && ii < idLen; )
		devID->mfg[jj++] = ZvgIO.mBfr[ii++];

	devID->mfg[jj] = '\0';

	ii += 3;						// skip ';',CR,LF

	// Get "CMD:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "CMD:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;

	for (jj = 0; jj < ZVG_MAX_IDSZ-1 && ZvgIO.mBfr[ii] != ';' && ii < idLen; )
		devID->cmd[jj++] = ZvgIO.mBfr[ii++];

	devID->cmd[jj] = '\0';

	ii += 3;						// skip ';',CR,LF

	// Get "MDL:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "MDL:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;

	for (jj = 0; jj < ZVG_MAX_IDSZ-1 && ZvgIO.mBfr[ii] != ';' && ii < idLen; )
		devID->mdl[jj++] = ZvgIO.mBfr[ii++];

	devID->mdl[jj] = '\0';

	ii += 3;						// skip ';',CR,LF

	// Get "VER:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "VER:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;

	devID->fVer = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ',' || ii >= idLen)
		return (errUnknownID);

	ii++;
	devID->bVer = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ',' || ii >= idLen)
		return (errUnknownID);

	ii++;
	devID->vVer = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ';' || ii >= idLen)
		return (errUnknownID);

	ii += 3;						// skip ';',CR,LF

	// Get "SWS:"

	if (strncmp( (char*)ZvgIO.mBfr + ii, "SWS:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;
	devID->sws = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 2;

	if (ZvgIO.mBfr[ii] != ';' || ii >= idLen)
		return (errUnknownID);

	ii += 3;						// skip ';',CR,LF

	// Get "ESB:" (Error Status Bits)

	if (strncmp( (char*)ZvgIO.mBfr + ii, "ESB:", 4) != 0 || ii >= idLen)
		return (errUnknownID);

	ii += 4;
	devID->fESB = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ',' || ii >= idLen)
		return (errUnknownID);

	ii++;
	devID->vESB = strtoul( (char*)ZvgIO.mBfr + ii, 0, 16);
	ii += 4;

	if (ZvgIO.mBfr[ii] != ';' || ii >= idLen)
		return (errUnknownID);

	return (err);
}